

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Map<asl::String,_char>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_char>::KeyVal>::operator=
          (Array<asl::Map<asl::String,_char>::KeyVal> *this,
          Array<asl::Map<asl::String,_char>::KeyVal> *b)

{
  char *pcVar1;
  KeyVal *pKVar2;
  
  if (this->_a != b->_a) {
    LOCK();
    pcVar1 = &this->_a[-1].value;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    UNLOCK();
    if (*(int *)pcVar1 == 0) {
      free(this,b);
    }
    pKVar2 = b->_a;
    this->_a = pKVar2;
    LOCK();
    pcVar1 = &pKVar2[-1].value;
    *(int *)pcVar1 = *(int *)pcVar1 + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

Array& operator=(const Array& b)
	{
		if (_a == b._a)
			return *this;
		if(--d().rc==0) free();
		_a = b._a;
		++d().rc;
		return *this;
	}